

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O3

TiXmlHandle __thiscall despot::util::tinyxml::TiXmlHandle::Child(TiXmlHandle *this,int count)

{
  bool bVar1;
  TiXmlNode *pTVar2;
  int in_EDX;
  undefined4 in_register_00000034;
  int iVar3;
  bool bVar4;
  
  if (*(long *)CONCAT44(in_register_00000034,count) != 0) {
    pTVar2 = *(TiXmlNode **)(*(long *)CONCAT44(in_register_00000034,count) + 0x28);
    bVar4 = pTVar2 != (TiXmlNode *)0x0;
    if (0 < in_EDX && bVar4) {
      iVar3 = 1;
      do {
        pTVar2 = pTVar2->next;
        bVar4 = pTVar2 != (TiXmlNode *)0x0;
        if (pTVar2 == (TiXmlNode *)0x0) break;
        bVar1 = iVar3 < in_EDX;
        iVar3 = iVar3 + 1;
      } while (bVar1);
    }
    if (bVar4) goto LAB_00170daf;
  }
  pTVar2 = (TiXmlNode *)0x0;
LAB_00170daf:
  this->node = pTVar2;
  return (TiXmlHandle)(TiXmlNode *)this;
}

Assistant:

TiXmlHandle TiXmlHandle::Child(int count) const {
	if (node) {
		int i;
		TiXmlNode* child = node->FirstChild();
		for (i = 0; child && i < count; child = child->NextSibling(), ++i) {
			// nothing
		}
		if (child)
			return TiXmlHandle(child);
	}
	return TiXmlHandle(0);
}